

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O1

int my_strmatch(char *big,char *little)

{
  char *pcVar1;
  char cVar2;
  ushort *puVar3;
  int iVar4;
  uint uVar5;
  size_t __n;
  ushort **ppuVar6;
  char *pcVar7;
  
  __n = strlen(little);
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
  pcVar7 = big + -1;
  do {
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar3 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
  iVar4 = strncmp(pcVar7,little,__n);
  uVar5 = 1;
  if (iVar4 == 0) {
    pcVar7 = pcVar7 + __n;
    do {
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 0x20) != 0);
    uVar5 = (uint)(cVar2 != '\0');
  }
  return uVar5;
}

Assistant:

static int
my_strmatch(const char *big, const char *little)
{
    size_t z = strlen(little);

    while (isspace(*big))
        big++;

    if (strncmp(big, little, z))
        return 1; /* No match */

    big += z;
    while (isspace(*big))
        big++;

    return *big != 0;
}